

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.h
# Opt level: O3

void hexdump(char *desc,void *addr,size_t len,FILE *fp)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  uchar buf [17];
  char local_48 [24];
  
  if (desc != (char *)0x0) {
    fprintf((FILE *)fp,"%s:\n",desc);
  }
  uVar3 = (uint)len;
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      if ((uVar2 & 0xf) == 0) {
        if (uVar2 != 0) {
          fprintf((FILE *)fp,"  |%s|\n",local_48);
        }
        fprintf((FILE *)fp,"%08x ",uVar2 & 0xffffffff);
      }
      else if ((uVar2 & 7) == 0) {
        fputc(0x20,(FILE *)fp);
      }
      fprintf((FILE *)fp," %02x",(ulong)*(byte *)((long)addr + uVar2));
      cVar1 = *(char *)((long)addr + uVar2);
      if ((byte)(*(char *)((long)addr + uVar2) + 0x81U) < 0xa1) {
        cVar1 = '.';
      }
      local_48[(uint)uVar2 & 0xf] = cVar1;
      local_48[(uVar2 & 0xf) + 1] = '\0';
      uVar2 = uVar2 + 1;
    } while ((len & 0xffffffff) != uVar2);
    if ((uVar3 & 0xf) - 9 < 0xfffffff8) {
      if ((len & 0xf) == 0) goto LAB_0010353e;
    }
    else {
      fputc(0x20,(FILE *)fp);
    }
    do {
      uVar3 = uVar3 + 1;
      fwrite("   ",3,1,(FILE *)fp);
    } while ((uVar3 & 0xf) != 0);
  }
LAB_0010353e:
  fprintf((FILE *)fp,"  |%s|\n",local_48);
  return;
}

Assistant:

static void hexdump(const char *desc, const void *addr, size_t len, FILE *fp) {
    unsigned int i;
    unsigned char buf[17];
    const unsigned char *pc = (const unsigned char*)addr;

    /* Output description if given. */
    if (desc != NULL) fprintf(fp, "%s:\n", desc);

    for (i = 0; i < (unsigned int)len; i++) {

        if ((i % 16) == 0) {
            if (i != 0) fprintf(fp, "  |%s|\n", buf);
            fprintf(fp, "%08x ", i);
        } else if ((i % 8) == 0) {
            fprintf(fp, " ");
        }
        fprintf(fp, " %02x", pc[i]);
        if ((pc[i] < 0x20) || (pc[i] > 0x7e)) {
            buf[i % 16] = '.';
        } else {
            buf[i % 16] = pc[i];
        }
        buf[(i % 16) + 1] = '\0';
    }
    if (i % 16 <= 8 && i % 16 != 0) fprintf(fp, " ");
    while ((i % 16) != 0) {
        fprintf(fp, "   ");
        i++;
    }
    fprintf(fp, "  |%s|\n", buf);
}